

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::
ParseFrom<(google::protobuf::MessageLite::ParseFlags)1,std::basic_string_view<char,std::char_traits<char>>>
          (MessageLite *this,basic_string_view<char,_std::char_traits<char>_> *input)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ClassDataFull *pCVar3;
  TcParseTableBase *msg;
  char *failure_msg;
  ParseFlags in_R9D;
  string_view input_00;
  LogMessageFatal local_20;
  ClassData *this_00;
  
  (*this->_vptr_MessageLite[2])();
  iVar2 = (*this->_vptr_MessageLite[4])(this);
  this_00 = (ClassData *)CONCAT44(extraout_var,iVar2);
  if (this_00 == (ClassData *)0x0) {
    failure_msg = "data != nullptr";
    iVar2 = 0x3a2;
LAB_0039b637:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.h"
               ,iVar2,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
  }
  msg = this_00->tc_table;
  if (msg == (TcParseTableBase *)0x0) {
    if (this_00->is_lite == true) {
      failure_msg = "!data->is_lite";
      iVar2 = 0x3a6;
      goto LAB_0039b637;
    }
    pCVar3 = internal::ClassData::full(this_00);
    msg = (*pCVar3->descriptor_methods->get_tc_table)(this);
  }
  input_00._M_str = (char *)this;
  input_00._M_len = (size_t)input->_M_str;
  bVar1 = internal::MergeFromImpl<false>
                    ((internal *)input->_M_len,input_00,(MessageLite *)msg,(TcParseTableBase *)0x1,
                     in_R9D);
  return bVar1;
}

Assistant:

bool MessageLite::ParseFrom(const T& input) {
  if (flags & kParse) Clear();
  constexpr bool alias = (flags & kMergeWithAliasing) != 0;
  const internal::TcParseTableBase* tc_table;
  PROTOBUF_ALWAYS_INLINE_CALL tc_table = GetTcParseTable();
  return internal::MergeFromImpl<alias>(input, this, tc_table, flags);
}